

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::javanano::MessageGenerator::GenerateHashCode
          (MessageGenerator *this,Printer *printer)

{
  bool bVar1;
  int iVar2;
  FieldDescriptor *field_00;
  FieldGenerator *pFVar3;
  FieldDescriptor *field;
  int i;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  iVar2 = Descriptor::field_count(this->descriptor_);
  if ((iVar2 != 0) || (bVar1 = Params::store_unknown_fields(this->params_), bVar1)) {
    io::Printer::Print(printer,"\n@Override\npublic int hashCode() {\n");
    io::Printer::Indent(printer);
    io::Printer::Print(printer,"int result = 17;\n");
    io::Printer::Print(printer,"result = 31 * result + getClass().getName().hashCode();\n");
    for (field._4_4_ = 0; iVar2 = Descriptor::field_count(this->descriptor_), field._4_4_ < iVar2;
        field._4_4_ = field._4_4_ + 1) {
      field_00 = Descriptor::field(this->descriptor_,field._4_4_);
      pFVar3 = FieldGeneratorMap::get(&this->field_generators_,field_00);
      (*pFVar3->_vptr_FieldGenerator[0xb])(pFVar3,printer);
    }
    bVar1 = Params::store_unknown_fields(this->params_);
    if (bVar1) {
      io::Printer::Print(printer,
                         "result = 31 * result + \n  (unknownFieldData == null || unknownFieldData.isEmpty() ? 0 : \n  unknownFieldData.hashCode());\n"
                        );
    }
    io::Printer::Print(printer,"return result;\n");
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"}\n");
  }
  return;
}

Assistant:

void MessageGenerator::GenerateHashCode(io::Printer* printer) {
  if (descriptor_->field_count() == 0 && !params_.store_unknown_fields()) {
    return;
  }

  printer->Print(
    "\n"
    "@Override\n"
    "public int hashCode() {\n");
  printer->Indent();

  printer->Print("int result = 17;\n");
  printer->Print("result = 31 * result + getClass().getName().hashCode();\n");
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    field_generators_.get(field).GenerateHashCodeCode(printer);
  }

  if (params_.store_unknown_fields()) {
    printer->Print(
      "result = 31 * result + \n"
      "  (unknownFieldData == null || unknownFieldData.isEmpty() ? 0 : \n"
      "  unknownFieldData.hashCode());\n");
  }

  printer->Print("return result;\n");

  printer->Outdent();
  printer->Print("}\n");
}